

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  size_t __size;
  long lVar1;
  uint uVar2;
  long lVar3;
  uint *lengths;
  long lVar4;
  size_t sVar5;
  
  lVar3 = 1;
  lVar4 = 0;
  sVar5 = numcodes * 4 + 4;
  do {
    __size = sVar5 - 4;
    lVar3 = lVar3 + -1;
    if (numcodes + lVar4 <= mincodes) break;
    lVar4 = lVar4 + -1;
    lVar1 = sVar5 - 8;
    sVar5 = __size;
  } while (*(int *)((long)frequencies + lVar1) == 0);
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (uint)(numcodes + lVar3);
  lengths = (uint *)realloc(tree->lengths,__size);
  tree->lengths = lengths;
  if (lengths == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    memset(lengths,0,__size);
    uVar2 = lodepng_huffman_code_lengths(lengths,frequencies,numcodes + lVar3,maxbitlen);
    if (uVar2 == 0) {
      uVar2 = HuffmanTree_makeFromLengths2(tree);
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  memset(tree->lengths, 0, numcodes * sizeof(unsigned));

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}